

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O0

int __thiscall
sliding_puzzle::SlidingPuzzle::calculateHammingDistance
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state)

{
  int iVar1;
  element_type *peVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  undefined4 local_2c;
  undefined4 local_28;
  int j;
  int i;
  int target_location [2];
  int hamming_distance;
  SlidingPuzzleStatePtr *state_local;
  SlidingPuzzle *this_local;
  
  target_location[0] = 0;
  local_28 = 0;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)state);
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&peVar2->state_);
    if (sVar3 <= (ulong)(long)local_28) break;
    local_2c = 0;
    while( true ) {
      peVar2 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar2->state_,(long)local_28);
      sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (sVar3 <= (ulong)(long)local_2c) break;
      peVar2 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar2->state_,(long)local_28);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_2c);
      if (*pvVar5 != 0) {
        peVar2 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)state);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&peVar2->state_,(long)local_28);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_2c);
        iVar1 = (*pvVar5 + -1) / puzzle_size;
        peVar2 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)state);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&peVar2->state_,(long)local_28);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_2c);
        if ((local_28 != iVar1) || (local_2c != (*pvVar5 + -1) % puzzle_size)) {
          target_location[0] = target_location[0] + 1;
        }
      }
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  return target_location[0];
}

Assistant:

int SlidingPuzzle::calculateHammingDistance(const SlidingPuzzleStatePtr& state)
{
  int hamming_distance = 0;

  int target_location[2];
  for (int i=0; i<state->state_.size(); ++i)
  {
    for (int j=0; j<state->state_[i].size(); ++j)
    {
      if (state->state_[i][j] != 0)
      {
        target_location[0] = (state->state_[i][j]-1)/puzzle_size;
        target_location[1] = (state->state_[i][j]-1)%puzzle_size;

        if (i != target_location[0] ||
            j != target_location[1])
        {
          hamming_distance += 1;
        }
      }
    }
  }

  return hamming_distance;
}